

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_host.c
# Opt level: O3

void test_distributed_fft_3d_compare(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  kiss_fft_cpx *pkVar5;
  kiss_fftnd_cfg st;
  void *__ptr;
  ulong uVar6;
  void *__ptr_00;
  uint uVar7;
  long lVar8;
  kiss_fft_cpx *pkVar9;
  float *pfVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  dfft_plan *pdVar14;
  undefined8 uVar15;
  undefined8 *puVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 *puVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  byte bVar23;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined8 auStack_338 [31];
  undefined8 uStack_240;
  int *piStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined *puStack_218;
  int *piStack_210;
  int s;
  kiss_fft_cpx *local_200;
  int *local_1f8;
  float *local_1f0;
  ulong local_1e8;
  uint local_1e0;
  int p;
  kiss_fft_cpx *local_1d8;
  ulong local_1d0;
  size_t local_1c8;
  undefined1 *local_1c0;
  int pidx [3];
  dfft_plan plan;
  
  bVar23 = 0;
  piStack_210 = (int *)0x10254d;
  MPI_Comm_size(&ompi_mpi_comm_world,&p);
  piStack_210 = (int *)0x10255a;
  MPI_Comm_rank(&ompi_mpi_comm_world,&s);
  piStack_210 = (int *)0x102564;
  local_1f8 = (int *)malloc(0xc);
  piStack_210 = (int *)0x10257a;
  fVar24 = powf((float)p,0.33333334);
  uVar11 = 1;
  do {
    uVar7 = uVar11;
    uVar11 = uVar7 * 2;
  } while ((int)uVar7 < (int)(fVar24 + 0.5));
  if (s == 0) {
    piStack_210 = (int *)0x1025b5;
    printf("Processor grid: ");
  }
  iVar21 = 1;
  lVar3 = 0;
  piVar4 = local_1f8;
  bVar22 = true;
  do {
    bVar18 = bVar22;
    uVar11 = 1;
    if ((int)(iVar21 * uVar7) <= p) {
      uVar11 = uVar7;
    }
    piVar4[lVar3] = uVar11;
    if (s == 0) {
      piStack_210 = (int *)0x1025f7;
      printf("%d x ",(ulong)uVar11);
      piVar4 = local_1f8;
    }
    iVar21 = iVar21 * uVar11;
    lVar3 = 1;
    bVar22 = false;
  } while (bVar18);
  uVar6 = (long)p / (long)iVar21;
  iVar2 = (int)uVar6;
  piVar4[2] = iVar2;
  if (s == 0) {
    piStack_210 = (int *)0x102638;
    printf("%d\n",uVar6 & 0xffffffff,(long)p % (long)iVar21 & 0xffffffff);
    piVar4 = local_1f8;
  }
  lVar3 = 2;
  iVar21 = s;
  do {
    iVar1 = piVar4[lVar3];
    pidx[lVar3] = iVar21 % iVar1;
    bVar22 = lVar3 != 0;
    lVar3 = lVar3 + -1;
    iVar21 = iVar21 / iVar1;
  } while (bVar22);
  piStack_210 = (int *)0x10265e;
  piVar4 = (int *)malloc(0xc);
  iVar21 = *local_1f8;
  puVar19 = (undefined1 *)(long)iVar21;
  local_200 = (kiss_fft_cpx *)((long)puVar19 << 2);
  *piVar4 = (int)local_200;
  iVar1 = local_1f8[1];
  local_1e8 = (long)iVar1 << 3;
  piVar4[1] = (int)local_1e8;
  uVar11 = iVar2 * 0x10;
  piVar4[2] = uVar11;
  lVar3 = 0;
  bVar22 = true;
  do {
    bVar18 = bVar22;
    if (s == 0) {
      piStack_210 = (int *)0x1026bb;
      printf("%d x ",(ulong)(uint)piVar4[lVar3]);
    }
    lVar3 = 1;
    bVar22 = false;
  } while (bVar18);
  if (s == 0) {
    piStack_210 = (int *)0x1026e6;
    printf("%d matrix\n",(ulong)uVar11);
  }
  uVar6 = local_1e8;
  pkVar5 = local_200;
  lVar3 = (long)(int)uVar11;
  local_1c8 = (long)local_200 * local_1e8 * lVar3 * 8;
  piStack_210 = (int *)0x10270c;
  local_1d8 = (kiss_fft_cpx *)malloc(local_1c8);
  piStack_210 = (int *)0x10271b;
  srand(0x3039);
  piStack_210 = (int *)0x102731;
  local_1e0 = uVar11;
  fVar24 = logf((float)(int)((int)uVar6 * (int)pkVar5 * uVar11));
  fVar24 = (fVar24 * -0.5) / 0.6931472 + 7.0;
  piStack_210 = (int *)0x10276d;
  fVar25 = powf(10.0,-fVar24);
  dVar27 = (double)fVar25;
  piStack_210 = (int *)0x102797;
  printf("Testing with %f sig digits, rel precision %f, abs precision %f\n",SUB84((double)fVar24,0),
         dVar27,dVar27);
  local_1c0 = puVar19;
  if (0 < iVar21) {
    local_1f0 = &local_1d8->i;
    local_1d0 = lVar3 * local_1e8 * 8;
    lVar8 = 0;
    do {
      if (0 < iVar1) {
        lVar20 = 0;
        pfVar10 = local_1f0;
        do {
          if (0 < iVar2) {
            lVar12 = 0;
            do {
              piStack_210 = (int *)0x1027f2;
              iVar21 = rand();
              pfVar10[lVar12 * 2 + -1] = (float)iVar21 * 4.656613e-10;
              piStack_210 = (int *)0x10280c;
              iVar21 = rand();
              pfVar10[lVar12 * 2] = (float)iVar21 * 4.656613e-10;
              lVar12 = lVar12 + 1;
            } while (lVar12 < lVar3);
          }
          lVar20 = lVar20 + 1;
          pfVar10 = pfVar10 + lVar3 * 2;
        } while (lVar20 < (long)local_1e8);
      }
      lVar8 = lVar8 + 1;
      local_1f0 = (float *)((long)local_1f0 + local_1d0);
    } while (lVar8 < (long)local_200);
  }
  piStack_210 = (int *)0x102860;
  pkVar5 = (kiss_fft_cpx *)malloc(local_1c8);
  piStack_210 = (int *)0x102879;
  st = kiss_fftnd_alloc(piVar4,3,0,(void *)0x0,(size_t *)0x0);
  piStack_210 = (int *)0x102891;
  kiss_fftnd(st,local_1d8,pkVar5);
  piStack_210 = (int *)0x10289b;
  __ptr = malloc(0x1000);
  if (0 < (int)local_1c0) {
    local_1c0 = (undefined1 *)((ulong)local_200 & 0xffffffff);
    local_1c8 = local_1e8 * lVar3 * 8;
    local_1d0 = (ulong)(uint)-(pidx[0] * 0x200 + pidx[1] * 0x80 + pidx[2] * 0x10);
    local_1f0 = (float *)0x0;
    local_200 = local_1d8;
    do {
      if (0 < iVar1) {
        uVar13 = 0;
        uVar6 = local_1d0;
        pkVar9 = local_200;
        do {
          if (0 < iVar2) {
            uVar17 = 0;
            do {
              if (((((long)uVar13 < (long)((int)((long)pidx[1] << 3) + 8) &&
                    (long)pidx[1] << 3 <= (long)uVar13) &&
                    ((long)local_1f0 < (long)((int)((long)pidx[0] << 2) + 4) &&
                    (long)pidx[0] << 2 <= (long)local_1f0)) &&
                  ((long)pidx[2] * 0x10 <= (long)uVar17)) &&
                 ((long)uVar17 < (long)((int)((long)pidx[2] * 0x10) + 0x10))) {
                *(kiss_fft_cpx *)((long)__ptr + (long)((int)uVar6 + (int)uVar17) * 8) =
                     pkVar9[uVar17];
              }
              uVar17 = uVar17 + 1;
            } while (local_1e0 != uVar17);
          }
          uVar13 = uVar13 + 1;
          pkVar9 = pkVar9 + lVar3;
          uVar6 = uVar6 + 0x10;
        } while (uVar13 != (local_1e8 & 0xffffffff));
      }
      local_1f0 = (float *)((long)local_1f0 + 1);
      local_200 = local_200 + local_1e8 * lVar3;
      local_1d0 = local_1d0 + 0x80;
    } while (local_1f0 != (float *)local_1c0);
  }
  piStack_210 = (int *)0x102a0b;
  __ptr_00 = malloc(0x1000);
  piStack_238 = pidx;
  piStack_210 = proc_map;
  puStack_218 = &ompi_mpi_comm_world;
  uVar6 = 0;
  uStack_220 = 0;
  uStack_228 = 0;
  uStack_230 = 0;
  uStack_240 = 0x102a50;
  dfft_create_plan(&plan,3,piVar4,0,0,local_1f8);
  pdVar14 = &plan;
  puVar16 = auStack_338;
  for (lVar3 = 0x26; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar16 = *(undefined8 *)pdVar14;
    pdVar14 = (dfft_plan *)((long)pdVar14 + (ulong)bVar23 * -0x10 + 8);
    puVar16 = puVar16 + (ulong)bVar23 * -2 + 1;
  }
  dfft_execute(__ptr,__ptr_00,0);
  do {
    fVar24 = *(float *)((long)__ptr_00 + uVar6 * 8);
    fVar25 = *(float *)((long)__ptr_00 + uVar6 * 8 + 4);
    dVar29 = (double)fVar24;
    uVar26 = SUB84(dVar29,0);
    iVar21 = ((((uint)(uVar6 >> 7) & 0x1ffffff) + pidx[0] * 4) * (int)local_1e8 +
             ((uint)(uVar6 >> 4) & 7 | pidx[1] << 3)) * local_1e0 +
             ((uint)uVar6 & 0xf | pidx[2] << 4);
    dVar28 = (double)pkVar5[iVar21].r;
    dVar31 = (double)pkVar5[iVar21].i;
    if (dVar27 <= ABS(dVar28)) {
      dVar30 = (dVar27 + 1.0) * dVar29;
      dVar29 = (1.0 - dVar27) * dVar29;
      if ((((0.0 <= fVar24) && (dVar28 <= dVar30)) && (dVar29 <= dVar28)) ||
         (((fVar24 < 0.0 && (dVar30 <= dVar28)) && (dVar28 <= dVar29)))) goto LAB_00102b85;
      uVar15 = 0x239;
LAB_00102ca0:
      piStack_210 = (int *)0x102ca7;
      printf("Test failed at line %d! %f != %f (rel tol: %f)\n",uVar26,dVar28,uVar15);
      goto LAB_00102ca7;
    }
    if (dVar27 + dVar27 < ABS(dVar29)) {
      uVar15 = 0x235;
LAB_00102c76:
      piStack_210 = (int *)0x102c7d;
      printf("Test failed at line %d! abs(%f) >= %f \n",uVar15);
LAB_00102ca7:
      piStack_210 = (int *)0x102cb1;
      exit(1);
    }
LAB_00102b85:
    dVar29 = (double)fVar25;
    uVar26 = SUB84(dVar29,0);
    if (dVar27 <= ABS(dVar31)) {
      dVar28 = (dVar27 + 1.0) * dVar29;
      dVar29 = (1.0 - dVar27) * dVar29;
      if ((((fVar25 < 0.0) || (dVar28 < dVar31)) || (dVar31 < dVar29)) &&
         (((0.0 <= fVar25 || (dVar31 < dVar28)) || (dVar29 < dVar31)))) {
        uVar15 = 0x242;
        dVar28 = dVar31;
        goto LAB_00102ca0;
      }
    }
    else if (dVar27 + dVar27 < ABS(dVar29)) {
      uVar15 = 0x23e;
      goto LAB_00102c76;
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x200) {
      piStack_210 = (int *)0x102c0b;
      free(local_1d8);
      piStack_210 = (int *)0x102c13;
      free(pkVar5);
      piStack_210 = (int *)0x102c1b;
      free(__ptr_00);
      piStack_210 = (int *)0x102c23;
      free(__ptr);
      piStack_210 = (int *)0x102c2b;
      free(piVar4);
      pdVar14 = &plan;
      puVar16 = auStack_338;
      for (lVar3 = 0x26; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar16 = *(undefined8 *)pdVar14;
        pdVar14 = (dfft_plan *)((long)pdVar14 + (ulong)bVar23 * -0x10 + 8);
        puVar16 = puVar16 + (ulong)bVar23 * -2 + 1;
      }
      dfft_destroy_plan();
      return;
    }
  } while( true );
}

Assistant:

void test_distributed_fft_3d_compare()
    {
    int s,p;
    MPI_Comm_size(MPI_COMM_WORLD, &p);
    MPI_Comm_rank(MPI_COMM_WORLD, &s);

    int nd = 3;
    int *pdim;
    pdim = (int *) malloc(sizeof(int)*nd);
    /* choose a decomposition */
    int r = powf(p,1.0/(double)nd)+0.5;
    int root = 1;
    while (root < r) root*=2;
    int ptot = 1;
    if (!s) printf("Processor grid: ");
    int i;
    for (i = 0; i < nd-1; ++i)
        {
        pdim[i] = (((ptot*root) > p) ? 1 : root);
        ptot *= pdim[i];
        if (!s) printf("%d x ",pdim[i]);
        }
    pdim[nd-1] = p/ptot;
    if (!s) printf("%d\n", pdim[nd-1]);

    /* determine processor index */
    int pidx[3];
    int idx = s;
    for (i = 2; i >= 0; --i)
        {
        pidx[i] = idx % pdim[i];
        idx /= pdim[i];
        }

    int *dim_glob;
    dim_glob = (int *) malloc(sizeof(int)*nd);

    // Do a pdim[0]*4 x pdim[1]* 8 x pdim[2] * 16 FFT (powers of two)
    int local_nx = 4;
    int local_ny = 8;
    int local_nz = 16;
    dim_glob[0] = pdim[0]*local_nx;
    dim_glob[1] = pdim[1]*local_ny;
    dim_glob[2] = pdim[2]*local_nz;

    for (i = 0; i < nd-1; ++i)
        if (!s) printf("%d x ",dim_glob[i]);
    if (!s) printf("%d matrix\n", dim_glob[nd-1]);

    kiss_fft_cpx *in_kiss;
    in_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    srand(12345);

    float scale = dim_glob[0]*dim_glob[1]*dim_glob[2];
    /* assume 0.5 sig digit loss per addition/twiddling (empirical)*/
    float sig_digits = 7.0-0.5*logf(scale)/logf(2.0);
    double tol = powf(10.0,-sig_digits);
    double abs_tol = 1.0*tol;
    printf("Testing with %f sig digits, rel precision %f, abs precision %f\n", sig_digits,  tol, abs_tol);

    // fill table with complex random numbers in row major order
    int x,y,z;
    int nx = dim_glob[0];
    int ny = dim_glob[1];
    int nz = dim_glob[2];
    for (x = 0; x < dim_glob[0]; ++x)
        for (y = 0; y < dim_glob[1]; ++y)
            for (z = 0; z < dim_glob[2]; ++z)
                {
                // KISS has column-major storage
                in_kiss[z+nz*(y+ny*x)].r = (float)rand()/(float)RAND_MAX;
                in_kiss[z+nz*(y+ny*x)].i = (float)rand()/(float)RAND_MAX;
                }

    kiss_fft_cpx *out_kiss;
    out_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    // construct forward transform
    kiss_fftnd_cfg cfg = kiss_fftnd_alloc(dim_glob,3,0,NULL,NULL);

    // carry out conventional FFT
    kiss_fftnd(cfg, in_kiss, out_kiss);

    // compare to distributed FFT
    cpx_t * in;
    in = (cpx_t *)malloc(sizeof(cpx_t)*local_nx*local_ny*local_nz);

    int x_local, y_local, z_local;
    for (x = 0; x < nx; ++x)
        for (y = 0; y < ny; ++y)
            for (z = 0; z < nz; ++z)
                {
                if (x>=pidx[0]*local_nx && x < (pidx[0]+1)*local_nx && 
                    y>=pidx[1]*local_ny && y < (pidx[1]+1)*local_ny &&
                    z>=pidx[2]*local_nz && z < (pidx[2]+1)*local_nz)
                    {
                    x_local = x - pidx[0]*local_nx;
                    y_local = y - pidx[1]*local_ny;
                    z_local = z - pidx[2]*local_nz;

                    RE(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].r;
                    IM(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].i;
                    }
                }

    cpx_t *out;
    out = (cpx_t *) malloc(local_nx*local_ny*local_nz*sizeof(cpx_t));

    dfft_plan plan;
    dfft_create_plan(&plan,3, dim_glob, NULL, NULL, pdim,pidx, 0, 0, 0, MPI_COMM_WORLD, proc_map);

    // forward transform
    dfft_execute(in, out, 0, plan);

    // do comparison
    int n_wave_local = local_nx * local_ny * local_nz;
    for (i = 0; i < n_wave_local; ++i)
        {

        x_local = i / local_ny / local_nz;
        y_local = (i - x_local*local_ny*local_nz)/local_nz;
        z_local = i % local_nz;

        x = pidx[0]*local_nx + x_local;
        y = pidx[1]*local_ny + y_local;
        z = pidx[2]*local_nz + z_local;

        double re = RE(out[i]);
        double im = IM(out[i]);
        double re_kiss = out_kiss[z+nz*(y+ny*x)].r;
        double im_kiss = out_kiss[z+nz*(y+ny*x)].i;  

        if (fabs(re_kiss) < abs_tol)
            {
            CHECK_SMALL(re,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(re,re_kiss, tol);
            }

        if (fabs(im_kiss) < abs_tol)
            {
            CHECK_SMALL(im,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(im, im_kiss, tol);
            }
        }
    free(in_kiss);
    free(out_kiss);
    free(out);
    free(in);
    free(dim_glob);
    dfft_destroy_plan(plan);
    }